

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O0

int ffgsdt(int *day,int *month,int *year,int *status)

{
  int *in_RCX;
  int *in_RDX;
  int *in_RSI;
  int *in_RDI;
  tm *date;
  time_t now;
  tm *local_30;
  time_t local_28;
  int *local_20;
  int *local_18;
  int *local_10;
  int *local_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_28 = time((time_t *)0x0);
  local_30 = gmtime(&local_28);
  if (local_30 == (tm *)0x0) {
    local_30 = localtime(&local_28);
  }
  *local_8 = local_30->tm_mday;
  *local_10 = local_30->tm_mon + 1;
  *local_18 = local_30->tm_year + 0x76c;
  return *local_20;
}

Assistant:

int ffgsdt( int *day, int *month, int *year, int *status )
{  
/*
      This routine is included for backward compatibility
            with the Fortran FITSIO library.

   ffgsdt : Get current System DaTe (GMT if available)

      Return integer values of the day, month, and year

         Function parameters:
            day      Day of the month
            month    Numerical month (1=Jan, etc.)
            year     Year (1999, 2000, etc.)
            status   output error status

*/
   time_t now;
   struct tm *date;

   now = time( NULL );
   date = gmtime(&now);         /* get GMT (= UTC) time */

   if (!date)                  /* GMT not available on this machine */
   {
       date = localtime(&now); 
   }

   *day = date->tm_mday;
   *month = date->tm_mon + 1;
   *year = date->tm_year + 1900;  /* tm_year is defined as years since 1900 */
   return( *status );
}